

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

shared_ptr<minja::Expression> __thiscall minja::Parser::parseLogicalOr(Parser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  int iVar2;
  runtime_error *prVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Parser *in_RSI;
  shared_ptr<minja::Expression> sVar4;
  Location location;
  shared_ptr<minja::Expression> right;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  parseLogicalAnd(this);
  if ((this->template_str).
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Expected left side of \'logical or\' expression");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (parseLogicalOr()::or_tok_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&parseLogicalOr()::or_tok_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&parseLogicalOr()::or_tok_abi_cxx11_,"or\\b",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &parseLogicalOr()::or_tok_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&parseLogicalOr()::or_tok_abi_cxx11_);
    }
  }
  get_location(&location,in_RSI);
  while( true ) {
    consumeToken((string *)&right,in_RSI,&parseLogicalOr()::or_tok_abi_cxx11_,Strip);
    _Var1 = right.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::__cxx11::string::~string((string *)&right);
    if (_Var1._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&location.source.
                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      sVar4.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      sVar4.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (shared_ptr<minja::Expression>)
             sVar4.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>;
    }
    parseLogicalAnd((Parser *)&right);
    if (right.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) break;
    std::
    make_shared<minja::BinaryOpExpr,minja::Location&,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::Expression>,minja::BinaryOpExpr::Op>
              ((Location *)&stack0xffffffffffffffc0,(shared_ptr<minja::Expression> *)&location,
               (shared_ptr<minja::Expression> *)this,(Op *)&right);
    std::__shared_ptr<minja::Expression,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<minja::Expression,(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<minja::BinaryOpExpr,_(__gnu_cxx::_Lock_policy)2> *)
               &stack0xffffffffffffffc0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&right.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar3,"Expected right side of \'or\' expression");
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<Expression> parseLogicalOr() {
        auto left = parseLogicalAnd();
        if (!left) throw std::runtime_error("Expected left side of 'logical or' expression");

        static std::regex or_tok(R"(or\b)");
        auto location = get_location();
        while (!consumeToken(or_tok).empty()) {
            auto right = parseLogicalAnd();
            if (!right) throw std::runtime_error("Expected right side of 'or' expression");
            left = std::make_shared<BinaryOpExpr>(location, std::move(left), std::move(right), BinaryOpExpr::Op::Or);
        }
        return left;
    }